

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isTexCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,float cmpReference,float result)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FilterMode FVar7;
  int iVar8;
  Texture2DArrayView *pTVar9;
  int layer;
  int coordZ;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int local_78;
  Vec2 local_68;
  Texture2DArrayView *local_60;
  TexComparePrecision *local_58;
  Vec2 *local_50;
  float local_44;
  Vec3 *local_40;
  Vec2 local_38;
  
  fVar10 = TexVerifierUtil::computeFloatingPointError(coord->m_data[2],(prec->coordBits).m_data[2]);
  local_58 = prec;
  fVar11 = TexVerifierUtil::computeFixedPointError((prec->uvwBits).m_data[2]);
  fVar13 = coord->m_data[2];
  fVar12 = floorf((fVar13 - (fVar11 + fVar10)) + 0.5);
  iVar4 = (int)fVar12;
  iVar8 = texture->m_numLevels;
  local_78 = -1;
  coordZ = -1;
  if (0 < iVar8) {
    coordZ = (texture->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar4 < coordZ) {
    coordZ = iVar4;
  }
  if (iVar4 < 0) {
    coordZ = 0;
  }
  local_60 = texture;
  fVar13 = floorf(fVar11 + fVar10 + fVar13 + 0.5);
  iVar4 = (int)fVar13;
  if (0 < iVar8) {
    local_78 = (local_60->m_levels->m_size).m_data[2] + -1;
  }
  if (iVar4 < local_78) {
    local_78 = iVar4;
  }
  local_40 = coord;
  local_50 = lodBounds;
  pTVar9 = local_60;
  fVar13 = local_44;
  if (iVar4 < 0) {
    local_78 = 0;
  }
  do {
    bVar1 = coordZ <= local_78;
    if (local_78 < coordZ) {
      return bVar1;
    }
    fVar10 = lodBounds->m_data[0];
    fVar11 = lodBounds->m_data[1];
    local_44 = sampler->lodThreshold;
    fVar12 = local_44;
    if (fVar10 <= local_44) {
      local_68.m_data = *(float (*) [2])coord->m_data;
      bVar2 = isLevelCompareResultValid
                        (pTVar9->m_levels,sampler,sampler->magFilter,local_58,&local_68,coordZ,
                         cmpReference,result);
      fVar12 = local_44;
      fVar13 = local_44;
      if (bVar2) {
        return bVar1;
      }
    }
    local_44 = fVar13;
    if (fVar12 < fVar11) {
      FVar7 = sampler->minFilter;
      if (FVar7 - NEAREST_MIPMAP_NEAREST < 4) {
        iVar8 = pTVar9->m_numLevels;
        switch(FVar7) {
        default:
          iVar8 = iVar8 + -1;
          fVar13 = ceilf(fVar10 + 0.5);
          iVar5 = (int)fVar13 + -1;
          iVar4 = iVar8;
          if (iVar5 < iVar8) {
            iVar4 = iVar5;
          }
          bVar2 = false;
          if (iVar5 < 0) {
            iVar4 = 0;
          }
          fVar13 = floorf(fVar11 + 0.5);
          iVar5 = (int)fVar13;
          if (iVar5 < iVar8) {
            iVar8 = iVar5;
          }
          if (iVar5 < 0) {
            iVar8 = 0;
          }
          bVar3 = iVar8 < iVar4;
          if (iVar4 <= iVar8) {
            do {
              uVar6 = sampler->minFilter - LINEAR;
              FVar7 = NEAREST;
              if (uVar6 < 5) {
                FVar7 = *(FilterMode *)(&DAT_00a06490 + (ulong)uVar6 * 4);
              }
              local_68.m_data = *(float (*) [2])local_40->m_data;
              bVar2 = isLevelCompareResultValid
                                (local_60->m_levels + iVar4,sampler,FVar7,local_58,&local_68,coordZ,
                                 cmpReference,result);
              if (bVar2) {
                bVar2 = true;
                goto LAB_00929d78;
              }
              iVar4 = iVar4 + 1;
              bVar3 = iVar8 < iVar4;
            } while (iVar4 <= iVar8);
            bVar2 = false;
          }
LAB_00929d78:
          pTVar9 = local_60;
          lodBounds = local_50;
          if (bVar3) {
LAB_00929d8d:
            bVar2 = false;
          }
          break;
        case NEAREST_MIPMAP_LINEAR:
        case LINEAR_MIPMAP_LINEAR:
          fVar13 = floorf(fVar10);
          iVar5 = (int)fVar13;
          iVar8 = iVar8 + -2;
          iVar4 = iVar8;
          if (iVar5 < iVar8) {
            iVar4 = iVar5;
          }
          if (iVar5 < 0) {
            iVar4 = 0;
          }
          fVar13 = floorf(fVar11);
          iVar5 = (int)fVar13;
          if (iVar5 < iVar8) {
            iVar8 = iVar5;
          }
          if (iVar5 < 0) {
            iVar8 = 0;
          }
          do {
            iVar5 = iVar4;
            if (iVar8 < iVar5) {
              bVar2 = false;
              goto LAB_00929d22;
            }
            uVar6 = sampler->minFilter - LINEAR;
            FVar7 = NEAREST;
            if (uVar6 < 5) {
              FVar7 = *(FilterMode *)(&DAT_00a06490 + (ulong)uVar6 * 4);
            }
            fVar13 = fVar10 - (float)iVar5;
            local_38.m_data[0] = 1.0;
            if (fVar13 <= 1.0) {
              local_38.m_data[0] = fVar13;
            }
            local_38.m_data[0] = (float)(~-(uint)(fVar13 < 0.0) & (uint)local_38.m_data[0]);
            fVar13 = fVar11 - (float)iVar5;
            local_38.m_data[1] = 1.0;
            if (fVar13 <= 1.0) {
              local_38.m_data[1] = fVar13;
            }
            local_38.m_data[1] = (float)(~-(uint)(fVar13 < 0.0) & (uint)local_38.m_data[1]);
            local_68.m_data = *(float (*) [2])coord->m_data;
            bVar2 = isMipmapLinearCompareResultValid
                              (local_60->m_levels + iVar5,local_60->m_levels + (iVar5 + 1),sampler,
                               FVar7,local_58,&local_68,coordZ,&local_38,cmpReference,result);
            iVar4 = iVar5 + 1;
          } while (!bVar2);
          bVar2 = true;
LAB_00929d22:
          pTVar9 = local_60;
          lodBounds = local_50;
          if (iVar8 < iVar5) goto LAB_00929d8d;
        }
      }
      else {
        local_68.m_data = *(float (*) [2])coord->m_data;
        bVar3 = isLevelCompareResultValid
                          (pTVar9->m_levels,sampler,FVar7,local_58,&local_68,coordZ,cmpReference,
                           result);
        bVar2 = true;
        if (!bVar3) goto LAB_00929d8d;
      }
      coord = local_40;
      if (bVar2) {
        return bVar1;
      }
    }
    coordZ = coordZ + 1;
    fVar13 = local_44;
  } while( true );
}

Assistant:

bool isTexCompareResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const TexComparePrecision& prec, const Vec3& coord, const Vec2& lodBounds, const float cmpReference, const float result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		const float		minLod			= lodBounds.x();
		const float		maxLod			= lodBounds.y();
		const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool		canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord.swizzle(0,1), layer, cmpReference, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel < maxTexLevel);

			if (isLinearMipmap)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearCompareResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord.swizzle(0,1), layer, Vec2(minF, maxF), cmpReference, result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelCompareResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord.swizzle(0,1), layer, cmpReference, result))
						return true;
				}
			}
			else
			{
				if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord.swizzle(0,1), layer, cmpReference, result))
					return true;
			}
		}
	}

	return false;
}